

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  byte *pbVar1;
  PointerBuilder builder_00;
  PointerReader reader;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Reader reader_00;
  Builder builder_05;
  Reader reader_01;
  Builder reader_02;
  Reader reader_03;
  PointerBuilder builder_06;
  PointerBuilder builder_07;
  PointerReader reader_04;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ListSchema LVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  undefined8 uVar9;
  undefined8 uVar10;
  WirePointer *pWVar11;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  undefined8 local_3c8;
  BuilderFor<capnp::DynamicList> list;
  Builder root;
  Reader local_338;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  ListElementCount local_2dc;
  Own<capnp::ClientHook> local_2d8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2c8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2a0;
  Builder local_278;
  Builder local_250;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1b0;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined1 local_150 [64];
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
  list_1.reader.ptr = (byte *)root._builder.pointers;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_180,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_04.builder.segment = (SegmentBuilder *)uStack_178;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)local_180;
  builder_04.builder.capTable = (CapTableBuilder *)local_170;
  builder_04.builder.data = (void *)uStack_168;
  builder_04.builder.pointers = (WirePointer *)local_160;
  builder_04.builder.dataSize = (undefined4)uStack_158;
  builder_04.builder.pointerCount = uStack_158._4_2_;
  builder_04.builder._38_2_ = uStack_158._6_2_;
  initDynamicTestMessage(builder_04);
  StructBuilder::asReader(&root._builder);
  bVar5 = list_1.reader.structPointerCount != 0;
  list.builder.segment = (SegmentBuilder *)0x0;
  if (bVar5) {
    list.builder.segment = (SegmentBuilder *)CONCAT44(list_1.reader.step,list_1.reader.elementCount)
    ;
  }
  iVar3 = 0x7fffffff;
  if (bVar5) {
    iVar3 = list_1.reader.nestingLimit;
  }
  uVar6 = 0;
  list.schema.elementType._4_4_ = 0;
  list.schema.elementType.field_4.scopeId._0_4_ = 0;
  list.schema.elementType.field_4.scopeId._4_4_ = 0;
  if (bVar5) {
    uVar6 = list_1.reader.segment._0_4_;
    list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
    list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
    list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
  }
  list.schema.elementType.baseType = (short)uVar6;
  list.schema.elementType.listDepth = (char)((uint)uVar6 >> 0x10);
  list.schema.elementType.isImplicitParam = (bool)(char)((uint)uVar6 >> 0x18);
  list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1b0,(Reader *)&list);
  reader_00._reader.capTable = local_1b0._reader.capTable;
  reader_00._reader.segment = local_1b0._reader.segment;
  reader_00._reader.data = local_1b0._reader.data;
  reader_00._reader.pointers = local_1b0._reader.pointers;
  reader_00._reader.dataSize = local_1b0._reader.dataSize;
  reader_00._reader.pointerCount = local_1b0._reader.pointerCount;
  reader_00._reader._38_2_ = local_1b0._reader._38_2_;
  reader_00._reader.nestingLimit = local_1b0._reader.nestingLimit;
  reader_00._reader._44_4_ = local_1b0._reader._44_4_;
  checkTestMessage(reader_00);
  StructBuilder::asReader(&root._builder);
  bVar5 = list_1.reader.structPointerCount != 0;
  list.builder.segment = (SegmentBuilder *)0x0;
  if (bVar5) {
    list.builder.segment = (SegmentBuilder *)CONCAT44(list_1.reader.step,list_1.reader.elementCount)
    ;
  }
  iVar3 = 0x7fffffff;
  if (bVar5) {
    iVar3 = list_1.reader.nestingLimit;
  }
  list.schema.elementType.baseType = VOID;
  list.schema.elementType.listDepth = '\0';
  list.schema.elementType.isImplicitParam = false;
  list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  list.schema.elementType._6_2_ = 0;
  list.schema.elementType.field_4.scopeId._0_4_ = 0;
  list.schema.elementType.field_4.scopeId._4_4_ = 0;
  if (bVar5) {
    list.schema.elementType._0_4_ = list_1.reader.segment._0_4_;
    list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
    list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
    list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
  }
  list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
  reader_04.segment._4_4_ = list_1.reader.step;
  reader_04.segment._0_4_ = list_1.reader.elementCount;
  reader_04.capTable._0_4_ = list_1.reader.structDataSize;
  reader_04.capTable._4_2_ = list_1.reader.structPointerCount;
  reader_04.capTable._6_1_ = list_1.reader.elementSize;
  reader_04.capTable._7_1_ = list_1.reader._39_1_;
  reader_04.pointer._0_4_ = list_1.reader.nestingLimit;
  reader_04.pointer._4_4_ = list_1.reader._44_4_;
  reader_04._24_8_ = local_3c8;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_04,(StructSchema)list.schema.elementType.field_4);
  reader_01.reader.segment = (SegmentReader *)uStack_210;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_218;
  reader_01.reader.capTable = (CapTableReader *)local_208;
  reader_01.reader.data = (void *)uStack_200;
  reader_01.reader.pointers = (WirePointer *)local_1f8;
  reader_01.reader.dataSize = (undefined4)uStack_1f0;
  reader_01.reader.pointerCount = uStack_1f0._4_2_;
  reader_01.reader._38_2_ = uStack_1f0._6_2_;
  reader_01.reader._40_8_ = local_1e8;
  checkDynamicTestMessage(reader_01);
  list_1.reader.ptr = (byte *)root._builder.pointers;
  builder_07.segment._4_4_ = list_1.reader.step;
  builder_07.segment._0_4_ = list_1.reader.elementCount;
  builder_07.capTable._0_4_ = list_1.reader.structDataSize;
  builder_07.capTable._4_2_ = list_1.reader.structPointerCount;
  builder_07.capTable._6_1_ = list_1.reader.elementSize;
  builder_07.capTable._7_1_ = list_1.reader._39_1_;
  builder_07.pointer._0_4_ = list_1.reader.nestingLimit;
  builder_07.pointer._4_4_ = list_1.reader._44_4_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (builder_07,(StructSchema)root._builder.segment);
  builder_05.builder.segment = (SegmentBuilder *)uStack_1d8;
  builder_05.schema.super_Schema.raw = (Schema)(Schema)local_1e0;
  builder_05.builder.capTable = (CapTableBuilder *)local_1d0;
  builder_05.builder.data = (void *)uStack_1c8;
  builder_05.builder.pointers = (WirePointer *)local_1c0;
  builder_05.builder.dataSize = (undefined4)uStack_1b8;
  builder_05.builder.pointerCount = uStack_1b8._4_2_;
  builder_05.builder._38_2_ = uStack_1b8._6_2_;
  checkDynamicTestMessage(builder_05);
  list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
  list_1.reader.ptr = (byte *)root._builder.pointers;
  ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&list);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x7b;
  DynamicList::Builder::set(&list,0,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x1c8;
  DynamicList::Builder::set(&list,1,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x315;
  DynamicList::Builder::set(&list,2,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x75bcd15;
  DynamicList::Builder::set(&list,3,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  StructBuilder::asReader(&root._builder);
  bVar5 = list.builder.ptr._4_2_ != 0;
  local_338._reader.data = (CapTableBuilder *)0x0;
  if (bVar5) {
    local_338._reader.data = list.builder.capTable;
  }
  local_338._reader.pointers._0_4_ = 0x7fffffff;
  if (bVar5) {
    local_338._reader.pointers._0_4_ = list.builder.elementCount;
  }
  local_338._reader.segment._0_2_ = VOID;
  local_338._reader.segment._2_1_ = '\0';
  local_338._reader.segment._3_1_ = false;
  local_338._reader.segment._4_2_ = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  local_338._reader.segment._6_2_ = 0;
  uVar6 = 0;
  uVar7 = 0;
  if (bVar5) {
    local_338._reader.segment._0_4_ = list.schema.elementType._0_4_;
    local_338._reader.segment._4_4_ = list.schema.elementType._4_4_;
    uVar6 = list.schema.elementType.field_4.scopeId._0_4_;
    uVar7 = list.schema.elementType.field_4.scopeId._4_4_;
  }
  local_338._reader.capTable = (CapTableReader *)CONCAT44(uVar7,uVar6);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&list_1,(Reader *)&local_338);
  if (list_1.reader.elementCount == 4) {
    if (kj::_::Debug::minSeverity < 3 && *(int *)list_1.reader.ptr != 0x7b) {
      list.schema.elementType.baseType = 0x7b;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      local_338._reader.segment._0_4_ = *(undefined4 *)list_1.reader.ptr;
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x96,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",(uint *)&list,
                 (uint *)&local_338);
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)(list_1.reader.ptr + (list_1.reader.step >> 3)) != 0x1c8) {
      list.schema.elementType.baseType = 0x1c8;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      local_338._reader.segment._0_4_ =
           *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 3));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x97,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",(uint *)&list,
                 (uint *)&local_338);
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)(list_1.reader.ptr + (list_1.reader.step >> 2)) != 0x315) {
      list.schema.elementType.baseType = 0x315;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      local_338._reader.segment._0_4_ =
           *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 2));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x98,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",(uint *)&list,
                 (uint *)&local_338);
    }
    uVar4 = (ulong)list_1.reader.step * 3 >> 3;
    if ((*(int *)(list_1.reader.ptr + uVar4) != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
      list.schema.elementType.baseType = 0xcd15;
      list.schema.elementType.listDepth = '[';
      list.schema.elementType.isImplicitParam = true;
      local_338._reader.segment._0_4_ = *(undefined4 *)(list_1.reader.ptr + uVar4);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x99,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
                 (char (*) [43])"failed: expected (123456789u) == (list[3])",(uint *)&list,
                 (uint *)&local_338);
    }
    StructBuilder::asReader(&root._builder);
    bVar5 = list_1.reader.structPointerCount != 0;
    list.builder.segment = (SegmentBuilder *)0x0;
    if (bVar5) {
      list.builder.segment =
           (SegmentBuilder *)CONCAT44(list_1.reader.step,list_1.reader.elementCount);
    }
    iVar3 = 0x7fffffff;
    if (bVar5) {
      iVar3 = list_1.reader.nestingLimit;
    }
    uVar6 = 0;
    list.schema.elementType._4_4_ = 0;
    list.schema.elementType.field_4.scopeId._0_4_ = 0;
    list.schema.elementType.field_4.scopeId._4_4_ = 0;
    if (bVar5) {
      uVar6 = list_1.reader.segment._0_4_;
      list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
      list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
      list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
    }
    list.schema.elementType.baseType = (short)uVar6;
    list.schema.elementType.listDepth = (char)((uint)uVar6 >> 0x10);
    list.schema.elementType.isImplicitParam = (bool)(char)((uint)uVar6 >> 0x18);
    list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
    LVar8 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar2 = LVar8.elementType._0_8_;
    reader.capTable = (CapTableReader *)list.schema.elementType.field_4.schema;
    reader.segment = (SegmentReader *)list.schema.elementType._0_8_;
    reader.pointer = (WirePointer *)list.builder.segment;
    reader._24_8_ = list.builder.capTable;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic((Reader *)local_150,reader,LVar8)
    ;
    local_338._reader.segment = (SegmentReader *)0x1c80000007b;
    local_338._reader.capTable = (CapTableReader *)0x75bcd1500000315;
    reader_03.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_150._8_8_;
    reader_03.schema.elementType.baseType = local_150._0_2_;
    reader_03.schema.elementType.listDepth = local_150[2];
    reader_03.schema.elementType.isImplicitParam = (bool)local_150[3];
    reader_03.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_150._4_2_;
    reader_03.schema.elementType._6_2_ = local_150._6_2_;
    reader_03.reader.segment = (SegmentReader *)local_150._16_8_;
    reader_03.reader.capTable = (CapTableReader *)local_150._24_8_;
    reader_03.reader.ptr = (byte *)local_150._32_8_;
    reader_03.reader.elementCount = local_150._40_4_;
    reader_03.reader.step = local_150._44_4_;
    reader_03.reader.structDataSize = local_150._48_4_;
    reader_03.reader.structPointerCount = local_150._52_2_;
    reader_03.reader.elementSize = local_150[0x36];
    reader_03.reader._39_1_ = local_150[0x37];
    reader_03.reader._40_8_ = local_150._56_8_;
    expected._M_len = sVar2;
    expected._M_array = (iterator)&local_338;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_03,expected);
    list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
    list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
    list_1.reader.ptr = (byte *)root._builder.pointers;
    LVar8 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar2 = LVar8.elementType._0_8_;
    builder_00.pointer = (WirePointer *)list_1.reader.ptr;
    builder_00.segment = (SegmentBuilder *)list_1.reader.segment;
    builder_00.capTable = (CapTableBuilder *)list_1.reader.capTable;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_250,builder_00,LVar8);
    list.schema.elementType.baseType = 0x7b;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x1c8;
    list.schema.elementType._6_2_ = 0;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)0x75bcd1500000315;
    reader_02.schema.elementType.field_4.schema = local_250.schema.elementType.field_4.schema;
    reader_02.schema.elementType.baseType = local_250.schema.elementType.baseType;
    reader_02.schema.elementType.listDepth = local_250.schema.elementType.listDepth;
    reader_02.schema.elementType.isImplicitParam = local_250.schema.elementType.isImplicitParam;
    reader_02.schema.elementType.field_3 = local_250.schema.elementType.field_3;
    reader_02.schema.elementType._6_2_ = local_250.schema.elementType._6_2_;
    reader_02.builder.segment = local_250.builder.segment;
    reader_02.builder.capTable = local_250.builder.capTable;
    reader_02.builder.ptr = local_250.builder.ptr;
    reader_02.builder.elementCount = local_250.builder.elementCount;
    reader_02.builder.step = local_250.builder.step;
    reader_02.builder.structDataSize = local_250.builder.structDataSize;
    reader_02.builder.structPointerCount = local_250.builder.structPointerCount;
    reader_02.builder.elementSize = local_250.builder.elementSize;
    reader_02.builder._39_1_ = local_250.builder._39_1_;
    expected_00._M_len = sVar2;
    expected_00._M_array = (iterator)&list;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>
              (reader_02,expected_00);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x2410;
    list.schema.elementType.listDepth = 'f';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    list_1.reader.segment._0_4_ = 6;
    list_1.reader.capTable = (CapTableReader *)0x4f93d8;
    list_1.reader.ptr = (byte *)0x4;
    name.content.size_ = 0x10;
    name.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    list.schema.elementType._0_8_ = root._builder.segment;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.capTable;
    list.builder.segment = (SegmentBuilder *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::Text>((BuilderFor<capnp::Text> *)&list_1,(Builder *)&list);
    bVar5 = capnp::operator==("foo",(Builder *)&list_1);
    uVar9 = local_250.builder._24_8_;
    uVar10 = local_250.builder._32_8_;
    pWVar11 = (WirePointer *)local_150._56_8_;
    if (!bVar5 && kj::_::Debug::minSeverity < 3) {
      list.schema.elementType._0_8_ = root._builder.segment;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.capTable;
      list.builder.segment = (SegmentBuilder *)root._builder.pointers;
      AnyPointer::Builder::getAs<capnp::Text>((BuilderFor<capnp::Text> *)&list_1,(Builder *)&list);
      kj::_::Debug::log<char_const(&)[70],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xa4,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", \"foo\", root.getAnyPointerField().getAs<Text>()"
                 ,(char (*) [70])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
                 (char (*) [4])0x4f93d8,(Builder *)&list_1);
      uVar9 = local_250.builder._24_8_;
      uVar10 = local_250.builder._32_8_;
      pWVar11 = (WirePointer *)local_150._56_8_;
    }
    list_1.reader._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
    Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,(Orphanage *)&list_1);
    OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
              (&local_278,&orphan.builder);
    builder_01._builder.capTable = local_278._builder.capTable;
    builder_01._builder.segment = local_278._builder.segment;
    builder_01._builder.data = local_278._builder.data;
    builder_01._builder.pointers = local_278._builder.pointers;
    builder_01._builder.dataSize = local_278._builder.dataSize;
    builder_01._builder.pointerCount = local_278._builder.pointerCount;
    builder_01._builder._38_2_ = local_278._builder._38_2_;
    initTestMessage(builder_01);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x2410;
    list.schema.elementType.listDepth = 'f';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
              (&local_338,&orphan.builder);
    list_1.reader.structDataSize = (StructDataBitCount)local_338._reader.data;
    list_1.reader.structPointerCount = (StructPointerCount)((ulong)local_338._reader.data >> 0x20);
    list_1.reader._38_2_ = SUB82((ulong)local_338._reader.data >> 0x30,0);
    list_1.reader.nestingLimit = (ListElementCount)local_338._reader.pointers;
    list_1.reader.ptr = (byte *)local_338._reader.segment;
    list_1.reader.elementCount = (ListElementCount)local_338._reader.capTable;
    list_1.reader.step = (BitsPerElementN<23>)((ulong)local_338._reader.capTable >> 0x20);
    list_1.reader.segment._0_4_ = 10;
    list_1.reader.capTable = (CapTableReader *)(schemas::s_a0a8f314b80b63fd + 0x48);
    name_00.content.size_ = 0x10;
    name_00.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name_00,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    list_1.reader.ptr = (byte *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
              (&local_2a0,(Builder *)&list_1);
    builder_02._builder.capTable = local_2a0._builder.capTable;
    builder_02._builder.segment = local_2a0._builder.segment;
    builder_02._builder.data = local_2a0._builder.data;
    builder_02._builder.pointers = local_2a0._builder.pointers;
    builder_02._builder.dataSize = local_2a0._builder.dataSize;
    builder_02._builder.pointerCount = local_2a0._builder.pointerCount;
    builder_02._builder._38_2_ = local_2a0._builder._38_2_;
    checkTestMessage(builder_02);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x2410;
    list.schema.elementType.listDepth = 'f';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestAllTypes>
              ((Orphan<capnp::DynamicValue> *)&list_1,&orphan);
    name_01.content.size_ = 0x10;
    name_01.content.ptr = "anyPointerField";
    DynamicStruct::Builder::adopt((Builder *)&list,name_01,(Orphan<capnp::DynamicValue> *)&list_1);
    OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&list_1.reader.elementCount);
    list_1.reader.ptr = (byte *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
              (&local_2c8,(Builder *)&list_1);
    builder_03._builder.capTable = local_2c8._builder.capTable;
    builder_03._builder.segment = local_2c8._builder.segment;
    builder_03._builder.data = local_2c8._builder.data;
    builder_03._builder.pointers = local_2c8._builder.pointers;
    builder_03._builder.dataSize = local_2c8._builder.dataSize;
    builder_03._builder.pointerCount = local_2c8._builder.pointerCount;
    builder_03._builder._38_2_ = local_2c8._builder._38_2_;
    checkTestMessage(builder_03);
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    list_1.reader._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
    Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
              ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&orphan,(Orphanage *)&list_1,3)
    ;
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    list_1.reader.ptr[0] = '\f';
    list_1.reader.ptr[1] = '\0';
    list_1.reader.ptr[2] = '\0';
    list_1.reader.ptr[3] = '\0';
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    pbVar1 = list_1.reader.ptr + (list_1.reader.step >> 3);
    pbVar1[0] = '\"';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    pbVar1 = list_1.reader.ptr + (list_1.reader.step >> 2);
    pbVar1[0] = '8';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x2410;
    list.schema.elementType.listDepth = 'f';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
              ((Reader *)&local_338,&orphan.builder);
    DynamicValue::Reader::
    Reader<capnp::List<unsigned_int,(capnp::Kind)0>::Reader,capnp::DynamicList::Reader>
              ((Reader *)&list_1,(Reader *)&local_338);
    name_02.content.size_ = 0x10;
    name_02.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name_02,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    list.schema.elementType._0_8_ = root._builder.segment;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.capTable;
    list.builder.segment = (SegmentBuilder *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
              ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&list_1,(Builder *)&list);
    if (list_1.reader.elementCount == 3) {
      if (kj::_::Debug::minSeverity < 3 && *(int *)list_1.reader.ptr != 0xc) {
        list.schema.elementType.baseType = TEXT;
        list.schema.elementType.listDepth = '\0';
        list.schema.elementType.isImplicitParam = false;
        local_338._reader.segment =
             (SegmentReader *)
             CONCAT44(local_338._reader.segment._4_4_,*(undefined4 *)list_1.reader.ptr);
        kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", 12, l[0]",
                   (char (*) [32])"failed: expected (12) == (l[0])",(int *)&list,(uint *)&local_338)
        ;
      }
      if (kj::_::Debug::minSeverity < 3 &&
          *(int *)(list_1.reader.ptr + (list_1.reader.step >> 3)) != 0x22) {
        list.schema.elementType.baseType = 0x22;
        list.schema.elementType.listDepth = '\0';
        list.schema.elementType.isImplicitParam = false;
        local_338._reader.segment =
             (SegmentReader *)
             CONCAT44(local_338._reader.segment._4_4_,
                      *(int *)(list_1.reader.ptr + (list_1.reader.step >> 3)));
        kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", 34, l[1]",
                   (char (*) [32])"failed: expected (34) == (l[1])",(int *)&list,(uint *)&local_338)
        ;
      }
      if ((*(int *)(list_1.reader.ptr + (list_1.reader.step >> 2)) != 0x38) &&
         (kj::_::Debug::minSeverity < 3)) {
        list.schema.elementType.baseType = 0x38;
        list.schema.elementType.listDepth = '\0';
        list.schema.elementType.isImplicitParam = false;
        local_338._reader.segment =
             (SegmentReader *)
             CONCAT44(local_338._reader.segment._4_4_,
                      *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 2)));
        kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", 56, l[2]",
                   (char (*) [32])"failed: expected (56) == (l[2])",(int *)&list,(uint *)&local_338)
        ;
      }
      OrphanBuilder::~OrphanBuilder(&orphan.builder);
      list.builder._24_8_ = root._builder._32_8_;
      list.builder.capTable = (CapTableBuilder *)root._builder.data;
      list.builder.ptr = (byte *)root._builder.pointers;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
      list.builder.segment = (SegmentBuilder *)root._builder.capTable;
      list.schema.elementType.baseType = 0x2410;
      list.schema.elementType.listDepth = 'f';
      list.schema.elementType.isImplicitParam = false;
      list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      list.schema.elementType._6_2_ = 0;
      Capability::Client::Client((Client *)&local_338,(void *)0x0);
      DynamicValue::Reader::Reader<capnp::Capability::Client,capnp::DynamicCapability::Client>
                ((Reader *)&list_1,(Client *)&local_338);
      name_03.content.size_ = 0x10;
      name_03.content.ptr = "anyPointerField";
      DynamicStruct::Builder::set((Builder *)&list,name_03,(Reader *)&list_1);
      DynamicValue::Reader::~Reader((Reader *)&list_1);
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_338);
      list_1.reader.ptr = (byte *)root._builder.pointers;
      builder_06.capTable = (CapTableBuilder *)uVar10;
      builder_06.segment = (SegmentBuilder *)uVar9;
      builder_06.pointer = pWVar11;
      PointerHelpers<capnp::Capability,_(capnp::Kind)5>::get(builder_06);
      kj::Own<capnp::ClientHook>::dispose(&local_2d8);
      MallocMessageBuilder::~MallocMessageBuilder(&builder);
      return;
    }
    local_338._reader.segment = (SegmentReader *)CONCAT44(local_338._reader.segment._4_4_,3);
    local_2dc = list_1.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
              ((Fault *)&list,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb7,FAILED,"(3) == (l.size())","3, l.size()",(int *)&local_338,&local_2dc);
    kj::_::Debug::Fault::fatal((Fault *)&list);
  }
  local_338._reader.segment = (SegmentReader *)CONCAT44(local_338._reader.segment._4_4_,4);
  orphan.builder.tag.content._0_4_ = list_1.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&list,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x95,FAILED,"(4u) == (list.size())","4u, list.size()",(uint *)&local_338,
             (uint *)&orphan);
  kj::_::Debug::Fault::fatal((Fault *)&list);
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}